

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::TrigFunc::innerExtrema
          (Interval *__return_storage_ptr__,TrigFunc *this,EvalContext *param_1,Interval *angle)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar10;
  
  dVar10 = angle->m_lo;
  dVar1 = angle->m_hi;
  iVar5 = (*(this->super_CFloatFunc1).super_FloatFunc1.
            super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            .
            super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            .super_FuncBase._vptr_FuncBase[0x10])(this);
  iVar6 = (*(this->super_CFloatFunc1).super_FloatFunc1.
            super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            .
            super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            .super_FuncBase._vptr_FuncBase[0x10])(dVar1,this);
  if (6.283185307179586 <= angle->m_hi - angle->m_lo) {
LAB_0079b78e:
    uVar4 = true;
    if ((this->m_hiExtremum).m_hasNaN == false) {
      uVar4 = (undefined1)*(undefined4 *)&this->m_loExtremum;
    }
    __return_storage_ptr__->m_hasNaN = (bool)uVar4;
    dVar10 = (this->m_loExtremum).m_lo;
    dVar1 = (this->m_loExtremum).m_hi;
    dVar2 = (this->m_hiExtremum).m_lo;
    dVar3 = (this->m_hiExtremum).m_hi;
    uVar7 = -(ulong)(dVar2 <= dVar10);
    uVar8 = -(ulong)(dVar1 <= dVar3);
    __return_storage_ptr__->m_lo = (double)(~uVar7 & (ulong)dVar10 | (ulong)dVar2 & uVar7);
    __return_storage_ptr__->m_hi = (double)(~uVar8 & (ulong)dVar1 | (ulong)dVar3 & uVar8);
  }
  else {
    if (iVar6 == -1 && iVar5 == 1) {
      __return_storage_ptr__->m_hi = (this->m_hiExtremum).m_hi;
      uVar9 = *(undefined8 *)&this->m_hiExtremum;
      dVar10 = (this->m_hiExtremum).m_lo;
    }
    else {
      if (iVar6 != 1 || iVar5 != -1) {
        if (iVar5 != iVar6) {
LAB_0079b77c:
          __return_storage_ptr__->m_hasNaN = false;
          __return_storage_ptr__->m_lo = INFINITY;
          __return_storage_ptr__->m_hi = -INFINITY;
          return __return_storage_ptr__;
        }
        (*(this->super_CFloatFunc1).super_FloatFunc1.
          super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .
          super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .super_FuncBase._vptr_FuncBase[0xd])(dVar1,this);
        (*(this->super_CFloatFunc1).super_FloatFunc1.
          super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .
          super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          .super_FuncBase._vptr_FuncBase[0xd])(dVar10,this);
        if (((uint)(0.0 < extraout_XMM0_Qa - extraout_XMM0_Qa_00) -
            (uint)(extraout_XMM0_Qa - extraout_XMM0_Qa_00 < 0.0)) * iVar5 != -1) goto LAB_0079b77c;
        goto LAB_0079b78e;
      }
      __return_storage_ptr__->m_hi = (this->m_loExtremum).m_hi;
      uVar9 = *(undefined8 *)&this->m_loExtremum;
      dVar10 = (this->m_loExtremum).m_lo;
    }
    *(undefined8 *)__return_storage_ptr__ = uVar9;
    __return_storage_ptr__->m_lo = dVar10;
  }
  return __return_storage_ptr__;
}

Assistant:

Interval		innerExtrema	(const EvalContext&, const Interval& angle) const
	{
		const double		lo		= angle.lo();
		const double		hi		= angle.hi();
		const int			loSlope	= doGetSlope(lo);
		const int			hiSlope	= doGetSlope(hi);

		// Detect the high and low values the function can take between the
		// interval endpoints.
		if (angle.length() >= 2.0 * DE_PI_DOUBLE)
		{
			// The interval is longer than a full cycle, so it must get all possible values.
			return m_hiExtremum | m_loExtremum;
		}
		else if (loSlope == 1 && hiSlope == -1)
		{
			// The slope can change from positive to negative only at the maximum value.
			return m_hiExtremum;
		}
		else if (loSlope == -1 && hiSlope == 1)
		{
			// The slope can change from negative to positive only at the maximum value.
			return m_loExtremum;
		}
		else if (loSlope == hiSlope &&
				 deIntSign(applyExact(hi) - applyExact(lo)) * loSlope == -1)
		{
			// The slope has changed twice between the endpoints, so both extrema are included.
			return m_hiExtremum | m_loExtremum;
		}

		return Interval();
	}